

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot value,uint32 slotIndex,uint8 dataWidth,
          ViewType viewType,uint32 offset)

{
  bool bVar1;
  uint32 local_14;
  undefined2 local_10;
  ViewType local_e;
  uint8 local_d;
  OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((DAT_0143bfdd == '\0') && (local_10 = (undefined2)value, value < 0x10000)) {
    layout.SlotIndex = offset;
    local_14 = slotIndex;
    local_e = viewType;
    local_d = dataWidth;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_14,0xc,
               &this->super_ByteCodeWriter,false);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmSimdTypedArr(OpCodeAsmJs op, RegSlot value, uint32 slotIndex, uint8 dataWidth, ArrayBufferView::ViewType viewType, uint32 offset)
    {
        OpLayoutT_AsmSimdTypedArr<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::template Assign<ArrayBufferView::ViewType>(layout.ViewType, viewType)
            && SizePolicy::Assign(layout.SlotIndex, slotIndex) && SizePolicy::template Assign<int8>(layout.DataWidth, dataWidth) && SizePolicy::Assign(layout.Offset, offset))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }